

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_add2hash2(FIOBJ dest,char *name,size_t name_len,FIOBJ val,uint8_t encoded)

{
  char *pcVar1;
  int *piVar2;
  char *pcVar3;
  uint64_t uVar4;
  FIOBJ FVar5;
  FIOBJ FVar6;
  FIOBJ FVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  bool bVar13;
  FIOBJ local_50;
  
  if (name_len != 0 && name != (char *)0x0) {
    do {
      if (*name != '[') {
        FVar7 = 0;
        uVar12 = 0xffffffff;
        local_50 = dest;
        goto LAB_0014b01d;
      }
      name = name + 1;
      name_len = name_len - 1;
    } while (name_len != 0);
  }
LAB_0014afeb:
  fiobj_free(val);
  piVar2 = __errno_location();
  *piVar2 = 0x5f;
  return -1;
LAB_0014b01d:
  pcVar3 = (char *)memchr(name,0x5b,name_len);
  if (pcVar3 == (char *)0x0) {
    sVar9 = name_len - 1;
    if (name[name_len - 1] != ']') {
      sVar9 = name_len;
    }
    if (encoded == '\0') {
      FVar5 = fiobj_str_new(name,sVar9);
    }
    else {
      FVar5 = http_urlstr2fiobj(name,sVar9);
    }
    FVar6 = fiobj_hash_replace(local_50,FVar5,val);
    if (FVar6 != 0) {
      if (FVar7 == 0) {
        if (((~(uint)FVar6 & 6) == 0 || (FVar6 & 1) != 0) ||
           (FVar7 = FVar6, *(char *)(FVar6 & 0xfffffffffffffff8) != ')')) {
          FVar7 = fiobj_ary_new2(4);
          fiobj_ary_push(FVar7,FVar6);
        }
        fiobj_ary_push(FVar7,val);
        fiobj_hash_replace(local_50,FVar5,FVar7);
      }
      else {
        fiobj_hash_replace(local_50,FVar5,FVar6);
        FVar6 = fiobj_hash_new();
        fiobj_hash_set(FVar6,FVar5,val);
        fiobj_ary_push(FVar7,FVar6);
      }
    }
    fiobj_free(FVar5);
    return 0;
  }
  if (pcVar3 == name) goto LAB_0014afeb;
  pcVar11 = pcVar3 + 1;
  pcVar1 = name + name_len;
  if (pcVar11 == pcVar1) {
    lVar8 = -1;
LAB_0014b2d0:
    sVar9 = (name_len + lVar8) - 1;
    if (name[(name_len + lVar8) - 1] != ']') {
      sVar9 = name_len + lVar8;
    }
    uVar4 = fio_siphash13(name,sVar9,0x144e87,0x1453b6);
    FVar7 = fiobj_hash_get2(local_50,uVar4);
    if (FVar7 == 0) {
      if (encoded == '\0') {
        FVar5 = fiobj_str_new(name,sVar9);
      }
      else {
        FVar5 = http_urlstr2fiobj(name,sVar9);
      }
      FVar7 = fiobj_ary_new2(4);
      fiobj_hash_set(local_50,FVar5,FVar7);
    }
    else {
      if (((~(uint)FVar7 & 6) != 0 && (FVar7 & 1) == 0) &&
         (*(char *)(FVar7 & 0xfffffffffffffff8) == ')')) goto LAB_0014b4a3;
      FVar6 = fiobj_ary_new2(4);
      fiobj_ary_push(FVar6,FVar7);
      if (encoded == '\0') {
        FVar5 = fiobj_str_new(name,sVar9);
      }
      else {
        FVar5 = http_urlstr2fiobj(name,sVar9);
      }
      fiobj_hash_replace(local_50,FVar5,FVar6);
      FVar7 = FVar6;
    }
    fiobj_free(FVar5);
LAB_0014b4a3:
    fiobj_ary_push(FVar7,val);
    return 0;
  }
  if (*pcVar11 == ']') {
    if (pcVar3 + 2 == pcVar1) {
      lVar8 = -2;
      goto LAB_0014b2d0;
    }
    if ((pcVar3[2] != '[') || (pcVar3[3] == ']')) goto LAB_0014afeb;
    pcVar11 = pcVar3 + -1;
    if (pcVar3[-1] != ']') {
      pcVar11 = pcVar3;
    }
    sVar9 = (long)pcVar11 - (long)name;
    uVar4 = fio_siphash13(name,sVar9,0x144e87,0x1453b6);
    FVar5 = fiobj_hash_get2(local_50,uVar4);
    if (FVar5 == 0) {
      if (encoded == '\0') {
        FVar6 = fiobj_str_new(name,sVar9);
      }
      else {
        FVar6 = http_urlstr2fiobj(name,sVar9);
      }
      FVar7 = fiobj_ary_new2(4);
LAB_0014b235:
      fiobj_hash_set(local_50,FVar6,FVar7);
      fiobj_free(FVar6);
    }
    else if (((~(uint)FVar5 & 6) == 0 || (FVar5 & 1) != 0) ||
            (FVar7 = FVar5, *(char *)(FVar5 & 0xfffffffffffffff8) != ')')) {
      if (encoded == '\0') {
        FVar6 = fiobj_str_new(name,sVar9);
      }
      else {
        FVar6 = http_urlstr2fiobj(name,sVar9);
      }
      FVar7 = fiobj_ary_new2(4);
      fiobj_ary_push(FVar7,FVar5);
      goto LAB_0014b235;
    }
    local_50 = fiobj_ary_index(FVar7,-1);
    if (((uint)local_50 & 7) != 4) {
      local_50 = fiobj_hash_new();
      fiobj_ary_push(FVar7,local_50);
    }
    pcVar11 = pcVar3 + 3;
    name_len = (long)pcVar1 - (long)pcVar11;
  }
  else {
    pcVar10 = pcVar3 + -1;
    if (pcVar3[-1] != ']') {
      pcVar10 = pcVar3;
    }
    sVar9 = (long)pcVar10 - (long)name;
    uVar4 = fio_siphash13(name,sVar9,0x144e87,0x1453b6);
    FVar5 = fiobj_hash_get2(local_50,uVar4);
    if (FVar5 == 0) {
      if (encoded == '\0') {
        FVar7 = fiobj_str_new(name,sVar9);
      }
      else {
        FVar7 = http_urlstr2fiobj(name,sVar9);
      }
      FVar5 = fiobj_hash_new();
      fiobj_hash_set(local_50,FVar7,FVar5);
      fiobj_free(FVar7);
LAB_0014b1ec:
      name_len = (long)pcVar1 - (long)pcVar11;
      bVar13 = true;
      FVar7 = 0;
      local_50 = FVar5;
    }
    else {
      if (((uint)FVar5 & 7) == 4) goto LAB_0014b1ec;
      bVar13 = false;
      pcVar11 = name;
    }
    if (!bVar13) goto LAB_0014afeb;
  }
  bVar13 = uVar12 < 2;
  name = pcVar11;
  uVar12 = uVar12 >> 1;
  if (bVar13) goto LAB_0014afeb;
  goto LAB_0014b01d;
}

Assistant:

int http_add2hash2(FIOBJ dest, char *name, size_t name_len, FIOBJ val,
                   uint8_t encoded) {
  if (!name)
    goto error;
  FIOBJ nested_ary = FIOBJ_INVALID;
  char *cut1;
  /* we can't start with an empty object name */
  while (name_len && name[0] == '[') {
    --name_len;
    ++name;
  }
  if (!name_len) {
    /* an empty name is an error */
    goto error;
  }
  uint32_t nesting = ((uint32_t)~0);
rebase:
  /* test for nesting level limit (limit at 32) */
  if (!nesting)
    goto error;
  /* start clearing away bits. */
  nesting >>= 1;
  /* since we might be rebasing, notice that "name" might be "name]" */
  cut1 = memchr(name, '[', name_len);
  if (!cut1)
    goto place_in_hash;
  /* simple case "name=" (the "=" was already removed) */
  if (cut1 == name) {
    /* an empty name is an error */
    goto error;
  }
  if (cut1 + 1 == name + name_len) {
    /* we have name[= ... autocorrect */
    name_len -= 1;
    goto place_in_array;
  }

  if (cut1[1] == ']') {
    /* Nested Array "name[]..." */

    /* Test for name[]= */
    if ((cut1 + 2) == name + name_len) {
      name_len -= 2;
      goto place_in_array;
    }

    /* Test for a nested Array format error */
    if (cut1[2] != '[' || cut1[3] == ']') { /* error, we can't parse this */
      goto error;
    }

    /* we have name[][key...= */

    /* ensure array exists and it's an array + set nested_ary */
    const size_t len = ((cut1[-1] == ']') ? (size_t)((cut1 - 1) - name)
                                          : (size_t)(cut1 - name));
    const uint64_t hash =
        fiobj_hash_string(name, len); /* hash the current name */
    nested_ary = fiobj_hash_get2(dest, hash);
    if (!nested_ary) {
      /* create a new nested array */
      FIOBJ key =
          encoded ? http_urlstr2fiobj(name, len) : fiobj_str_new(name, len);
      nested_ary = fiobj_ary_new2(4);
      fiobj_hash_set(dest, key, nested_ary);
      fiobj_free(key);
    } else if (!FIOBJ_TYPE_IS(nested_ary, FIOBJ_T_ARRAY)) {
      /* convert existing object to an array - auto error correction */
      FIOBJ key =
          encoded ? http_urlstr2fiobj(name, len) : fiobj_str_new(name, len);
      FIOBJ tmp = fiobj_ary_new2(4);
      fiobj_ary_push(tmp, nested_ary);
      nested_ary = tmp;
      fiobj_hash_set(dest, key, nested_ary);
      fiobj_free(key);
    }

    /* test if last object in the array is a hash - create hash if not */
    dest = fiobj_ary_index(nested_ary, -1);
    if (!dest || !FIOBJ_TYPE_IS(dest, FIOBJ_T_HASH)) {
      dest = fiobj_hash_new();
      fiobj_ary_push(nested_ary, dest);
    }

    /* rebase `name` to `key` and restart. */
    cut1 += 3; /* consume "[][" */
    name_len -= (size_t)(cut1 - name);
    name = cut1;
    goto rebase;

  } else {
    /* we have name[key]... */
    const size_t len = ((cut1[-1] == ']') ? (size_t)((cut1 - 1) - name)
                                          : (size_t)(cut1 - name));
    const uint64_t hash =
        fiobj_hash_string(name, len); /* hash the current name */
    FIOBJ tmp = fiobj_hash_get2(dest, hash);
    if (!tmp) {
      /* hash doesn't exist, create it */
      FIOBJ key =
          encoded ? http_urlstr2fiobj(name, len) : fiobj_str_new(name, len);
      tmp = fiobj_hash_new();
      fiobj_hash_set(dest, key, tmp);
      fiobj_free(key);
    } else if (!FIOBJ_TYPE_IS(tmp, FIOBJ_T_HASH)) {
      /* type error, referencing an existing object that isn't a Hash */
      goto error;
    }
    dest = tmp;
    /* no rollback is possible once we enter the new nesting level... */
    nested_ary = FIOBJ_INVALID;
    /* rebase `name` to `key` and restart. */
    cut1 += 1; /* consume "[" */
    name_len -= (size_t)(cut1 - name);
    name = cut1;
    goto rebase;
  }

place_in_hash:
  if (name[name_len - 1] == ']')
    --name_len;
  {
    FIOBJ key = encoded ? http_urlstr2fiobj(name, name_len)
                        : fiobj_str_new(name, name_len);
    FIOBJ old = fiobj_hash_replace(dest, key, val);
    if (old) {
      if (nested_ary) {
        fiobj_hash_replace(dest, key, old);
        old = fiobj_hash_new();
        fiobj_hash_set(old, key, val);
        fiobj_ary_push(nested_ary, old);
      } else {
        if (!FIOBJ_TYPE_IS(old, FIOBJ_T_ARRAY)) {
          FIOBJ tmp = fiobj_ary_new2(4);
          fiobj_ary_push(tmp, old);
          old = tmp;
        }
        fiobj_ary_push(old, val);
        fiobj_hash_replace(dest, key, old);
      }
    }
    fiobj_free(key);
  }
  return 0;

place_in_array:
  if (name[name_len - 1] == ']')
    --name_len;
  {
    uint64_t hash = fiobj_hash_string(name, name_len);
    FIOBJ ary = fiobj_hash_get2(dest, hash);
    if (!ary) {
      FIOBJ key = encoded ? http_urlstr2fiobj(name, name_len)
                          : fiobj_str_new(name, name_len);
      ary = fiobj_ary_new2(4);
      fiobj_hash_set(dest, key, ary);
      fiobj_free(key);
    } else if (!FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)) {
      FIOBJ tmp = fiobj_ary_new2(4);
      fiobj_ary_push(tmp, ary);
      ary = tmp;
      FIOBJ key = encoded ? http_urlstr2fiobj(name, name_len)
                          : fiobj_str_new(name, name_len);
      fiobj_hash_replace(dest, key, ary);
      fiobj_free(key);
    }
    fiobj_ary_push(ary, val);
  }
  return 0;
error:
  fiobj_free(val);
  errno = EOPNOTSUPP;
  return -1;
}